

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O0

void __thiscall QHostInfoRunnable::~QHostInfoRunnable(QHostInfoRunnable *this)

{
  QHostInfoRunnable *in_RDI;
  
  ~QHostInfoRunnable(in_RDI);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

QHostInfoRunnable::~QHostInfoRunnable()
    = default;